

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_efb276::HandleRepeatCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  char __c;
  string_view value;
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference name;
  size_type __n;
  const_iterator __first;
  const_iterator __last;
  char *pcVar5;
  uint local_118;
  allocator<char> local_111;
  uint i;
  allocator<char> local_e9;
  string local_e8 [32];
  string local_c8 [8];
  string result;
  size_type inStringLength;
  value_type *variableName;
  value_type *stringValue;
  string local_88;
  size_type local_68;
  unsigned_long times;
  allocator<char> local_49;
  string local_48;
  cmMakefile *local_28;
  cmMakefile *makefile;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  makefile = (cmMakefile *)status;
  status_local = (cmExecutionStatus *)args;
  local_28 = cmExecutionStatus::GetMakefile(status);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
  pcVar1 = local_28;
  if (sVar3 == 4) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = cmStrToULong(pvVar4,&local_68);
    pcVar1 = local_28;
    if (bVar2) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      name = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,3);
      result.field_2._8_8_ = std::__cxx11::string::size();
      std::__cxx11::string::string(local_c8);
      if (result.field_2._8_8_ != 0) {
        if (result.field_2._8_8_ == 1) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
          __c = *pcVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_e8,local_68,__c,&local_e9);
          std::__cxx11::string::operator=(local_c8,local_e8);
          std::__cxx11::string::~string(local_e8);
          std::allocator<char>::~allocator(&local_e9);
        }
        else {
          __n = result.field_2._8_8_ * local_68;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&i,__n,'\0',&local_111);
          std::__cxx11::string::operator=(local_c8,(string *)&i);
          std::__cxx11::string::~string((string *)&i);
          std::allocator<char>::~allocator(&local_111);
          for (local_118 = 0; local_118 < local_68; local_118 = local_118 + 1) {
            __first = std::cbegin<std::__cxx11::string>(pvVar4);
            __last = std::cend<std::__cxx11::string>(pvVar4);
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_c8);
            std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )__last._M_current,pcVar5);
          }
        }
      }
      pcVar1 = local_28;
      value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_c8);
      cmMakefile::AddDefinition(pcVar1,name,value);
      args_local._7_1_ = 1;
      std::__cxx11::string::~string(local_c8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"repeat count is not a positive number.",
                 (allocator<char> *)((long)&stringValue + 7));
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stringValue + 7));
      args_local._7_1_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"sub-command REPEAT requires three arguments.",&local_49);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    args_local._7_1_ = 1;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleRepeatCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  cmMakefile& makefile = status.GetMakefile();

  // `string(REPEAT "<str>" <times> OUTPUT_VARIABLE)`
  enum ArgPos : std::size_t
  {
    SUB_COMMAND,
    VALUE,
    TIMES,
    OUTPUT_VARIABLE,
    TOTAL_ARGS
  };

  if (args.size() != ArgPos::TOTAL_ARGS) {
    makefile.IssueMessage(MessageType::FATAL_ERROR,
                          "sub-command REPEAT requires three arguments.");
    return true;
  }

  unsigned long times;
  if (!cmStrToULong(args[ArgPos::TIMES], &times)) {
    makefile.IssueMessage(MessageType::FATAL_ERROR,
                          "repeat count is not a positive number.");
    return true;
  }

  const auto& stringValue = args[ArgPos::VALUE];
  const auto& variableName = args[ArgPos::OUTPUT_VARIABLE];
  const auto inStringLength = stringValue.size();

  std::string result;
  switch (inStringLength) {
    case 0u:
      // Nothing to do for zero length input strings
      break;
    case 1u:
      // NOTE If the string to repeat consists of the only character,
      // use the appropriate constructor.
      result = std::string(times, stringValue[0]);
      break;
    default:
      result = std::string(inStringLength * times, char{});
      for (auto i = 0u; i < times; ++i) {
        std::copy(cm::cbegin(stringValue), cm::cend(stringValue),
                  &result[i * inStringLength]);
      }
      break;
  }

  makefile.AddDefinition(variableName, result);
  return true;
}